

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall
llm_graph_input_attn_no_cache::set_input(llm_graph_input_attn_no_cache *this,llama_ubatch *ubatch)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long in_RSI;
  long in_RDI;
  int i_2;
  int s_1;
  float f_1;
  int32_t ti_1;
  int i_1;
  int s0_1;
  int32_t tj_1;
  int j_1;
  llama_seq_id seq_id_1;
  int s1_1;
  int h_1;
  float *data_1;
  int64_t n_stride;
  int64_t n_seqs_1;
  int64_t n_seq_tokens_1;
  int64_t n_tokens_1;
  int s;
  float f;
  int32_t ti;
  int i;
  int s0;
  int32_t tj;
  int j;
  llama_seq_id seq_id;
  int s1;
  int h;
  float *data;
  int64_t n_seqs;
  int64_t n_seq_tokens;
  int64_t n_tokens;
  int64_t n_kv;
  uint local_b4;
  int local_b0;
  float local_ac;
  int local_a4;
  int local_a0;
  int local_98;
  int local_90;
  int local_8c;
  int local_60;
  float local_5c;
  int local_54;
  int local_50;
  int local_48;
  int local_40;
  int local_3c;
  
  if (*(long *)(in_RDI + 8) != 0) {
    if ((*(byte *)(*(long *)(in_RDI + 0x20) + 0x39) & 1) == 0) {
      uVar1 = *(uint *)(in_RSI + 4);
      uVar11 = (ulong)uVar1;
      uVar2 = *(uint *)(in_RSI + 8);
      uVar3 = *(uint *)(in_RSI + 0xc);
      uVar12 = (ulong)*(uint *)(in_RSI + 4);
      uVar9 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 8) + 8));
      if ((uVar9 & 1) == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,0x17a,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(kq_mask->buffer)");
      }
      lVar6 = *(long *)(*(long *)(in_RDI + 8) + 0xf8);
      for (local_8c = 0; local_8c < 1; local_8c = local_8c + 1) {
        for (local_90 = 0; (long)local_90 < (long)(ulong)uVar3; local_90 = local_90 + 1) {
          iVar5 = **(int **)(*(long *)(in_RSI + 0x30) + (long)local_90 * 8);
          for (local_98 = 0; (long)local_98 < (long)(ulong)uVar2; local_98 = local_98 + 1) {
            iVar7 = local_90 * uVar2 + local_98;
            for (local_a0 = 0; local_b4 = uVar1, (long)local_a0 < (long)(ulong)uVar3;
                local_a0 = local_a0 + 1) {
              for (local_a4 = 0; (long)local_a4 < (long)(ulong)uVar2; local_a4 = local_a4 + 1) {
                iVar8 = local_a0 * uVar2 + local_a4;
                local_ac = -INFINITY;
                for (local_b0 = 0;
                    local_b0 < *(int *)(*(long *)(in_RSI + 0x28) + (long)local_a0 * 4);
                    local_b0 = local_b0 + 1) {
                  if (*(int *)(*(long *)(*(long *)(in_RSI + 0x30) + (long)local_a0 * 8) +
                              (long)local_b0 * 4) == iVar5) {
                    if ((*(byte *)(*(long *)(in_RDI + 0x18) + 0x1905) & 1) == 0) {
                      local_ac = 0.0;
                    }
                    else {
                      iVar10 = *(int *)(*(long *)(in_RSI + 0x20) + (long)iVar8 * 4) -
                               *(int *)(*(long *)(in_RSI + 0x20) + (long)iVar7 * 4);
                      if (iVar10 < 1) {
                        iVar10 = -iVar10;
                      }
                      local_ac = (float)-iVar10;
                    }
                    break;
                  }
                }
                *(float *)(lVar6 + ((long)local_8c * uVar11 * uVar11 + (long)iVar7 * uVar12 +
                                   (long)iVar8) * 4) = local_ac;
              }
            }
            for (; (long)(int)local_b4 < (long)uVar12; local_b4 = local_b4 + 1) {
              *(undefined4 *)
               (lVar6 + ((long)local_8c * uVar11 * uVar11 + (long)iVar7 * uVar12 +
                        (long)(int)local_b4) * 4) = 0xff800000;
            }
          }
        }
      }
    }
    else {
      uVar1 = *(uint *)(in_RSI + 4);
      uVar2 = *(uint *)(in_RSI + 4);
      uVar3 = *(uint *)(in_RSI + 8);
      uVar4 = *(uint *)(in_RSI + 0xc);
      uVar9 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 8) + 8));
      if ((uVar9 & 1) == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,0x154,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(kq_mask->buffer)");
      }
      lVar6 = *(long *)(*(long *)(in_RDI + 8) + 0xf8);
      for (local_3c = 0; local_3c < 1; local_3c = local_3c + 1) {
        for (local_40 = 0; (long)local_40 < (long)(ulong)uVar4; local_40 = local_40 + 1) {
          iVar5 = **(int **)(*(long *)(in_RSI + 0x30) + (long)local_40 * 8);
          for (local_48 = 0; (long)local_48 < (long)(ulong)uVar3; local_48 = local_48 + 1) {
            iVar7 = local_40 * uVar3 + local_48;
            for (local_50 = 0; (long)local_50 < (long)(ulong)uVar4; local_50 = local_50 + 1) {
              for (local_54 = 0; (long)local_54 < (long)(ulong)uVar3; local_54 = local_54 + 1) {
                iVar8 = local_50 * uVar3 + local_54;
                local_5c = -INFINITY;
                for (local_60 = 0;
                    local_60 < *(int *)(*(long *)(in_RSI + 0x28) + (long)local_50 * 4);
                    local_60 = local_60 + 1) {
                  if ((*(int *)(*(long *)(*(long *)(in_RSI + 0x30) + (long)local_50 * 8) +
                               (long)local_60 * 4) == iVar5) &&
                     (*(int *)(*(long *)(in_RSI + 0x20) + (long)iVar8 * 4) <=
                      *(int *)(*(long *)(in_RSI + 0x20) + (long)iVar7 * 4))) {
                    if ((*(byte *)(*(long *)(in_RDI + 0x18) + 0x1905) & 1) == 0) {
                      local_5c = 0.0;
                    }
                    else {
                      iVar10 = *(int *)(*(long *)(in_RSI + 0x20) + (long)iVar8 * 4) -
                               *(int *)(*(long *)(in_RSI + 0x20) + (long)iVar7 * 4);
                      if (iVar10 < 1) {
                        iVar10 = -iVar10;
                      }
                      local_5c = (float)-iVar10;
                    }
                    break;
                  }
                }
                *(float *)(lVar6 + ((long)local_3c * (ulong)uVar1 * (ulong)uVar2 +
                                    (long)iVar7 * (ulong)uVar1 + (long)iVar8) * 4) = local_5c;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_attn_no_cache::set_input(const llama_ubatch * ubatch) {
    if (kq_mask) {
        if (cparams.causal_attn) {
            const int64_t n_kv         = ubatch->n_tokens;
            const int64_t n_tokens     = ubatch->n_tokens;
            const int64_t n_seq_tokens = ubatch->n_seq_tokens;
            const int64_t n_seqs       = ubatch->n_seqs;

            GGML_ASSERT(ggml_backend_buffer_is_host(kq_mask->buffer));
            float * data = (float *) kq_mask->data;

            for (int h = 0; h < 1; ++h) {
                for (int s1 = 0; s1 < n_seqs; ++s1) {
                    const llama_seq_id seq_id = ubatch->seq_id[s1][0];

                    for (int j = 0; j < n_seq_tokens; ++j) {
                        const int32_t tj = s1*n_seq_tokens + j;

                        for (int s0 = 0; s0 < n_seqs; ++s0) {
                            for (int i = 0; i < n_seq_tokens; ++i) {
                                const int32_t ti = s0*n_seq_tokens + i;
                                float f = -INFINITY;

                                for (int s = 0; s < ubatch->n_seq_id[s0]; ++s) {
                                    if (ubatch->seq_id[s0][s] == seq_id && ubatch->pos[ti] <= ubatch->pos[tj]) {
                                        if (hparams.use_alibi) {
                                            f = -std::abs(ubatch->pos[ti] - ubatch->pos[tj]);
                                        } else {
                                            f = 0.0f;
                                        }
                                        break;
                                    }
                                }

                                data[h*(n_kv*n_tokens) + tj*n_kv + ti] = f;
                            }
                        }
                    }
                }
            }
        } else {
            const int64_t n_tokens     = ubatch->n_tokens;
            const int64_t n_seq_tokens = ubatch->n_seq_tokens;
            const int64_t n_seqs       = ubatch->n_seqs;
            const int64_t n_stride     = ubatch->n_tokens;

            GGML_ASSERT(ggml_backend_buffer_is_host(kq_mask->buffer));

            float * data = (float *) kq_mask->data;

            for (int h = 0; h < 1; ++h) {
                for (int s1 = 0; s1 < n_seqs; ++s1) {
                    const llama_seq_id seq_id = ubatch->seq_id[s1][0];

                    for (int j = 0; j < n_seq_tokens; ++j) {
                        const int32_t tj = s1*n_seq_tokens + j;

                        for (int s0 = 0; s0 < n_seqs; ++s0) {
                            for (int i = 0; i < n_seq_tokens; ++i) {
                                const int32_t ti = s0*n_seq_tokens + i;
                                float f = -INFINITY;

                                for (int s = 0; s < ubatch->n_seq_id[s0]; ++s) {
                                    if (ubatch->seq_id[s0][s] == seq_id) {
                                        if (hparams.use_alibi) {
                                            f = -std::abs(ubatch->pos[ti] - ubatch->pos[tj]);
                                        } else {
                                            f = 0.0f;
                                        }
                                        break;
                                    }
                                }

                                data[h*(n_tokens*n_tokens) + tj*n_stride + ti] = f;
                            }
                        }

                        for (int i = n_tokens; i < n_stride; ++i) {
                            data[h*(n_tokens*n_tokens) + tj*n_stride + i] = -INFINITY;
                        }
                    }
                }
            }
        }
    }
}